

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HApp.cpp
# Opt level: O2

int testIO(char *filename)

{
  int iVar1;
  HPresolve *this;
  ostream *poVar2;
  allocator aStack_165c1;
  string asStack_165c0 [32];
  string asStack_165a0 [32];
  HModel model;
  int iStack_15f70;
  int iStack_15f68;
  HinOut h;
  HDual solver;
  
  HModel::HModel(&model);
  std::__cxx11::string::string(asStack_165a0,"fileIO",(allocator *)&solver);
  std::__cxx11::string::string(asStack_165c0,"fileIO",&aStack_165c1);
  HinOut::HinOut(&h,asStack_165a0,asStack_165c0);
  std::__cxx11::string::~string(asStack_165c0);
  std::__cxx11::string::~string(asStack_165a0);
  HinOut::HinOutTestRead(&h,&model);
  if (iStack_15f70 == 0) {
    std::operator<<((ostream *)&std::cout,"Empty problem");
    iVar1 = 1;
    goto LAB_0010648a;
  }
  this = (HPresolve *)operator_new(0xb18);
  HPresolve::HPresolve(this);
  HModel::copy_fromHModelToHPresolve((HPresolve *)&model);
  iVar1 = HPresolve::presolve();
  if (iVar1 == 3) {
    HPresolve::postsolve();
    HModel::load_fromPostsolve((HPresolve *)&model);
    HDual::HDual(&solver);
    HDual::solve((HModel *)&solver,(int)&model,0);
    HModel::util_reportSolverOutcome((char *)&model);
LAB_00106444:
    HDual::~HDual(&solver);
  }
  else {
    if (iVar1 == 0) {
      HModel::load_fromPresolve((HPresolve *)&model);
      HDual::HDual(&solver);
      HDual::solve((HModel *)&solver,(int)&model,0);
      HPresolve::setProblemStatus((int)this);
      poVar2 = std::operator<<((ostream *)&std::cout," STATUS = ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,iStack_15f68);
      std::endl<char,std::char_traits<char>>(poVar2);
      HModel::util_getPrimalDualValues
                ((vector *)&model,(vector *)(this + 0xf0),(vector *)(this + 0x108),
                 (vector *)(this + 0x120));
      HModel::util_getBasicIndexNonbasicFlag((vector *)&model,(vector *)(this + 600));
      HPresolve::postsolve();
      HModel::load_fromPostsolve((HPresolve *)&model);
      HDual::solve((HModel *)&solver,(int)&model,0);
      HModel::util_reportSolverOutcome((char *)&model);
      goto LAB_00106444;
    }
    poVar2 = std::operator<<((ostream *)&std::cout,"Status return from presolve: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  HPresolve::~HPresolve(this);
  operator_delete(this);
  iVar1 = 0;
LAB_0010648a:
  HinOut::~HinOut(&h);
  HModel::~HModel(&model);
  return iVar1;
}

Assistant:

int testIO(const char *filename) {
//testIO solve the problem in file with presolve

	HModel model;

	HinOut h("fileIO", "fileIO");
	h.HinOutTestRead(model);

	// Check size
	if (model.numRow == 0) {
		cout<<"Empty problem";
		return 1;
	}
	else if (1) {
		HPresolve * pre = new HPresolve();
		model.copy_fromHModelToHPresolve(pre);
		int status = pre->presolve();

		if (!status) {
			//pre->reportTimes();
			model.load_fromPresolve(pre);
			HDual solver;
			solver.solve(&model);
			pre->setProblemStatus(model.getPrStatus());
			cout<<" STATUS = " << model.getPrStatus() <<endl;
			model.util_getPrimalDualValues(pre->colValue, pre->colDual, pre->rowValue, pre->rowDual);
			model.util_getBasicIndexNonbasicFlag(pre->basicIndex, pre->nonbasicFlag);
			pre->postsolve();
			model.load_fromPostsolve(pre);
			solver.solve(&model);
			model.util_reportSolverOutcome("Postsolve");
		}
		else if (status == HPresolve::Empty) {
			pre->postsolve();
			model.load_fromPostsolve(pre);
			HDual solver;

			solver.solve(&model);
			model.util_reportSolverOutcome("Postsolve");
		}
		else cout <<"Status return from presolve: "<< status<< endl;
		delete pre;
	}
	else {
	  HDual solver;
	  HPresolve * pre = new HPresolve();
	  model.copy_fromHModelToHPresolve(pre);
	  //pre->initializeVectors();
	  //pre->print(0);
	  model.initWithLogicalBasis();
	  solver.solve(&model);
	  model.util_reportSolverOutcome("testIO");
	}
	return 0;
}